

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedreader.cpp
# Opt level: O2

ssize_t __thiscall
hbm::BufferedReader::recv(BufferedReader *this,int __fd,void *__buf,size_t __n,int __flags)

{
  size_t sVar1;
  size_t sVar2;
  ulong __n_00;
  iovec iov [2];
  
  sVar2 = this->m_alreadyRead;
  __n_00 = this->m_fillLevel - sVar2;
  if (__n_00 < __n) {
    if (__n_00 == 0) {
      iov[1].iov_len = 0x40000;
      iov[0].iov_base = __buf;
      iov[0].iov_len = __n;
      iov[1].iov_base = this;
      sVar1 = readv(__fd,(iovec *)iov,2);
      this->m_alreadyRead = 0;
      sVar2 = 0;
      if (sVar1 - __n != 0 && (long)__n <= (long)sVar1) {
        sVar2 = sVar1 - __n;
      }
      if ((long)sVar1 < (long)__n) {
        __n = sVar1;
      }
      this->m_fillLevel = sVar2;
    }
    else {
      memcpy(__buf,this->m_buffer + sVar2,__n_00);
      this->m_alreadyRead = this->m_fillLevel;
      __n = __n_00;
    }
  }
  else {
    memcpy(__buf,this->m_buffer + sVar2,__n);
    this->m_alreadyRead = this->m_alreadyRead + __n;
  }
  return __n;
}

Assistant:

ssize_t BufferedReader::recv(int sockfd, void *buf, size_t desiredLen)
	{
		// check whether there is something left
		size_t bytesLeft = m_fillLevel - m_alreadyRead;

		if(bytesLeft>=desiredLen) {
			// there is more than or as much as desired
			memcpy(buf, m_buffer+m_alreadyRead, desiredLen);
			m_alreadyRead += desiredLen;
			return static_cast < ssize_t > (desiredLen);
		} else if(bytesLeft>0) {
			// return the rest which is less than desired (a short read)
			memcpy(buf, m_buffer+m_alreadyRead, bytesLeft);
			m_alreadyRead = m_fillLevel;
			return static_cast < ssize_t > (bytesLeft);
		}

		// try to read as much as possible into the provided buffer.In addition we fill our internal buffer if there is already more to read.
		// readv saves us from reading into the internal buffer first and copying into the provided buffer afterwards.
		struct iovec iov[2];
		iov[0].iov_base = buf;
		iov[0].iov_len = desiredLen;
		iov[1].iov_base = m_buffer;
		iov[1].iov_len = sizeof(m_buffer);

		ssize_t retVal = ::readv(sockfd, iov, 2);
		m_alreadyRead = 0;

		if (retVal>static_cast < ssize_t > (desiredLen)) {
			// readv returns the total number of bytes read
			m_fillLevel = retVal-desiredLen;
			return static_cast < ssize_t > (desiredLen);
		}
		m_fillLevel = 0;
		return retVal;
	}